

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
          (SourceLocationCommentPrinter *this,string *output)

{
  long lVar1;
  string local_38;
  string *local_18;
  string *output_local;
  SourceLocationCommentPrinter *this_local;
  
  if ((this->have_source_loc_ & 1U) != 0) {
    local_18 = output;
    output_local = (string *)this;
    lVar1 = std::__cxx11::string::size();
    if (lVar1 != 0) {
      FormatComment(&local_38,this,&(this->source_loc_).trailing_comments);
      std::__cxx11::string::operator+=((string *)local_18,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return;
}

Assistant:

void AddPostComment(string* output) {
    if (have_source_loc_ && source_loc_.trailing_comments.size() > 0) {
      *output += FormatComment(source_loc_.trailing_comments);
    }
  }